

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O1

void __thiscall wabt::AST::AST(AST *this,ModuleContext *mc,Func *f)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  uint uVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string s;
  long *local_80;
  long local_70;
  long lStack_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_60;
  
  this->mc = mc;
  (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->f = f;
  this->value_stack_depth = 0;
  p_Var1 = &(this->vars_defined)._M_t._M_impl.super__Rb_tree_header;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->flushed_vars = 0;
  (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->cur_block_id = 0;
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  if (f != (Func *)0x0) {
    ModuleContext::BeginFunc(mc,f);
    if ((int)((ulong)((long)(f->decl).sig.param_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(f->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) != 0) {
      paVar3 = &local_60.first.field_2;
      uVar8 = 0;
      do {
        local_60.first._M_string_length = 0;
        local_60.first.field_2._M_local_buf[0] = '\0';
        uVar7 = uVar8;
        local_60.first._M_dataplus._M_p = (pointer)paVar3;
        do {
          std::__cxx11::string::push_back((char)&local_60);
          bVar5 = 0x19 < uVar7;
          uVar7 = uVar7 / 0x1a - 1;
        } while (bVar5);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1a60fe);
        plVar2 = plVar6 + 2;
        if ((long *)*plVar6 == plVar2) {
          local_70 = *plVar2;
          lStack_68 = plVar6[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar2;
          local_80 = (long *)*plVar6;
        }
        lVar4 = plVar6[1];
        *plVar6 = (long)plVar2;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.first._M_dataplus._M_p != paVar3) {
          operator_delete(local_60.first._M_dataplus._M_p);
        }
        local_60.first._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,local_80,lVar4 + (long)local_80);
        local_60.second.block_id = 0;
        local_60.second.defined = false;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
                    *)&this->vars_defined,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.first._M_dataplus._M_p != paVar3) {
          operator_delete(local_60.first._M_dataplus._M_p);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (uint)((ulong)((long)(f->decl).sig.param_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(f->decl).sig.param_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
  }
  return;
}

Assistant:

AST(ModuleContext& mc, const Func *f) : mc(mc), f(f) {
    if (f) {
      mc.BeginFunc(*f);
      for (Index i = 0; i < f->GetNumParams(); i++) {
        auto name = "$" + IndexToAlphaName(i);
        vars_defined.insert({ name, { 0, false }});
      }
    }
  }